

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void Am_Choice_List_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_90;
  long local_88;
  long local_80;
  undefined1 local_78 [8];
  Am_Value_List new_value;
  undefined1 local_60 [3];
  bool separate_extend;
  Am_Input_Char ic;
  Am_Object ref_object;
  Am_Object local_50;
  Am_Object new_object;
  undefined1 local_38 [8];
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Choice_How_Set how_set;
  Am_Object *inter_local;
  
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set((Am_Choice_How_Set *)&old_value.value,pAVar2);
  pAVar2 = Am_Object::Get(inter,0x169,3);
  Am_Value::Am_Value((Am_Value *)&old_value_list.item,pAVar2);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_38);
  bVar1 = Am_Value_List::Test((Am_Value *)&old_value_list.item);
  if (bVar1) {
    Am_Value_List::operator=((Am_Value_List *)local_38,(Am_Value *)&old_value_list.item);
  }
  else if ((short)old_value_list.item == -0x5fff) {
    Am_Value_List::Add((Am_Value_List *)local_38,(Am_Value *)&old_value_list.item,Am_TAIL,true);
  }
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&local_50,pAVar2);
  bVar1 = Am_Choice_How_Set::operator==((Am_Choice_How_Set *)&old_value.value,Am_CHOICE_LIST_TOGGLE)
  ;
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0x12e,0);
    Am_Object::Am_Object((Am_Object *)local_60,pAVar2);
    pAVar2 = Am_Object::Get(inter,0x11b,0);
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)((long)&new_value.item + 4),pAVar2);
    new_value.item._3_1_ = new_value.item._6_1_ >> 1 & 1;
    bVar1 = Am_Object::Valid((Am_Object *)local_60);
    if (bVar1) {
      bVar1 = Am_Object::Valid(&local_50);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(inter,0x1ef,0);
        Am_Object::operator=(&local_50,pAVar2);
      }
    }
    else {
      Am_Object::operator=((Am_Object *)local_60,&local_50);
    }
    list_final_value((Am_Object *)local_78,inter,&local_50,(Am_Value_List *)local_60,
                     SUB81(local_38,0));
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_78);
    Am_Object::Set(inter,0x169,pAVar3,1);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)local_60);
    Am_Object::Set(inter,0x16d,pAVar3,1);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_78);
    Am_Object::~Am_Object((Am_Object *)local_60);
    goto LAB_0030c539;
  }
  Am_Object::Set(&local_50,0x173,false,1);
  Am_Value_List::Start((Am_Value_List *)local_38);
  local_80 = Am_CHOICE_TOGGLE.value;
  bVar1 = Am_Choice_How_Set::operator==((Am_Choice_How_Set *)&old_value.value,Am_CHOICE_TOGGLE);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
    bVar1 = Am_Value_List::Member((Am_Value_List *)local_38,pAVar3);
    if (!bVar1) goto LAB_0030c447;
LAB_0030c465:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
    Am_Object::Set(inter,0x169,pAVar3,0);
  }
  else {
LAB_0030c447:
    local_88 = Am_CHOICE_CLEAR.value;
    bVar1 = Am_Choice_How_Set::operator==((Am_Choice_How_Set *)&old_value.value,Am_CHOICE_CLEAR);
    if (bVar1) goto LAB_0030c465;
    bVar1 = Am_Object::Valid(&local_50);
    if (bVar1) {
      Am_Object::Set(&local_50,0x172,true,1);
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Object::Set(inter,0x169,pAVar3,1);
  }
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(inter,0x16d,pAVar3,1);
LAB_0030c539:
  Am_Object::Set(inter,0x16c,(Am_Value *)&old_value_list.item,1);
  Am_Object::Am_Object(&local_90,inter);
  Am_Copy_Values_To_Command(&local_90);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_38);
  Am_Value::~Am_Value((Am_Value *)&old_value_list.item);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Do, (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  Am_Value old_value = inter.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_Value_List old_value_list;
  if (Am_Value_List::Test(old_value))
    old_value_list = old_value;
  else if (old_value.type == Am_OBJECT)
    old_value_list.Add(old_value);
  Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool separate_extend = ic.control;
    if (!ref_object.Valid())
      ref_object = new_object;
    else if (!new_object.Valid())
      new_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);
    // clears interim value and sets new value
    Am_Value_List new_value = list_final_value(inter, new_object, ref_object,
                                               old_value_list, separate_extend);
    inter.Set(Am_VALUE, new_value, Am_OK_IF_NOT_THERE);
    inter.Set(Am_OBJECT_MODIFIED, ref_object, Am_OK_IF_NOT_THERE);
  } else {
    Am_REPORT_SET_SEL_VALUE(false, inter, new_object, false);
    new_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    old_value_list.Start();
    if ((how_set == Am_CHOICE_TOGGLE && old_value_list.Member(new_object)) ||
        how_set == Am_CHOICE_CLEAR)
      inter.Set(Am_VALUE, Am_No_Object); // empty
    else {
      if (new_object.Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_object, true);
        new_object.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
      inter.Set(Am_VALUE, new_object, Am_OK_IF_NOT_THERE);
    }
    inter.Set(Am_OBJECT_MODIFIED, new_object, Am_OK_IF_NOT_THERE);
  }
  inter.Set(Am_OLD_VALUE, old_value, Am_OK_IF_NOT_THERE);
  Am_Copy_Values_To_Command(inter);
}